

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderPackingFunctionTests.cpp
# Opt level: O3

IterateResult __thiscall deqp::gles31::Functional::PackUnorm4x8Case::iterate(PackUnorm4x8Case *this)

{
  ostringstream *poVar1;
  uint uVar2;
  ShaderExecutor *pSVar3;
  deUint32 dVar4;
  long lVar5;
  long lVar6;
  char *description;
  int iVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  float fVar15;
  float fVar16;
  float extraout_XMM0_Db;
  float fVar18;
  float extraout_XMM0_Dc;
  float fVar19;
  float extraout_XMM0_Dd;
  float fVar20;
  undefined1 auVar17 [16];
  uint uVar21;
  uint uVar25;
  uint uVar26;
  undefined1 auVar22 [16];
  uint uVar27;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar28 [16];
  float fVar29;
  float fVar30;
  float fVar31;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> inputs;
  void *out;
  vector<unsigned_int,_std::allocator<unsigned_int>_> outputs;
  Random rnd;
  void *in;
  undefined1 local_248 [16];
  long local_238;
  float local_22c;
  pointer local_228;
  int aiStack_220 [2];
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  int iStack_204;
  int iStack_200;
  int iStack_1fc;
  float local_1f8;
  uint uStack_1f4;
  uint uStack_1f0;
  uint uStack_1ec;
  undefined1 local_1e8 [16];
  pointer local_1d8;
  ulong local_1d0;
  deRandom local_1c8;
  undefined1 local_1b8 [8];
  undefined8 auStack_1b0 [14];
  ios_base local_140 [272];
  
  dVar4 = deStringHash((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                       super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&local_1c8,dVar4 ^ 0x776002);
  local_238 = 0;
  local_248 = (undefined1  [16])0x0;
  local_1d8 = (pointer)0x0;
  local_1e8 = (undefined1  [16])0x0;
  local_22c = 1.4013e-45;
  if (1 < this->m_precision - PRECISION_MEDIUMP) {
    local_22c = (float)((uint)(this->m_precision == PRECISION_LOWP) * 2);
  }
  local_1b8._0_4_ = 0.0;
  local_1b8._4_4_ = 0.0;
  auStack_1b0[0]._0_4_ = 0.0;
  auStack_1b0[0]._4_4_ = 0.0;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)local_248,
             (Vector<float,_4> *)local_1b8);
  local_1b8 = (undefined1  [8])0x3f800000bf800000;
  auStack_1b0[0]._0_1_ = (ostringstream)0x0;
  auStack_1b0[0]._1_7_ = 0x3f800000bf8000;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)local_248,
             (Vector<float,_4> *)local_1b8);
  local_1b8 = (undefined1  [8])0xbf0000003f000000;
  auStack_1b0[0]._0_1_ = (ostringstream)0x0;
  auStack_1b0[0]._1_7_ = 0x3f000000bf0000;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)local_248,
             (Vector<float,_4> *)local_1b8);
  local_1b8 = (undefined1  [8])0x3fc00000bfc00000;
  auStack_1b0[0]._0_1_ = (ostringstream)0x0;
  auStack_1b0[0]._1_7_ = 0x3fc00000bfc000;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)local_248,
             (Vector<float,_4> *)local_1b8);
  local_1b8 = (undefined1  [8])0xbf4000003e800000;
  auStack_1b0[0]._0_1_ = (ostringstream)0x0;
  auStack_1b0[0]._1_7_ = 0x3f400000be8000;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)local_248,
             (Vector<float,_4> *)local_1b8);
  iVar7 = 0xf;
  do {
    fVar15 = deRandom_getFloat(&local_1c8);
    local_1f8 = fVar15 * 1.25 + -0.125;
    fVar15 = deRandom_getFloat(&local_1c8);
    local_208 = fVar15 * 1.25 + -0.125;
    local_218 = deRandom_getFloat(&local_1c8);
    fVar15 = deRandom_getFloat(&local_1c8);
    auStack_1b0[0]._0_4_ = local_218 * 1.25 + -0.125;
    auStack_1b0[0]._4_4_ = fVar15 * 1.25 + -0.125;
    local_1b8._4_4_ = local_208;
    local_1b8._0_4_ = local_1f8;
    std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
    emplace_back<tcu::Vector<float,4>>
              ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)local_248,
               (Vector<float,_4> *)local_1b8);
    iVar7 = iVar7 + -1;
  } while (iVar7 != 0);
  iVar7 = 0x50;
  do {
    fVar15 = deRandom_getFloat(&local_1c8);
    local_1f8 = fVar15 * 1e+06 + -100000.0;
    fVar15 = deRandom_getFloat(&local_1c8);
    local_208 = fVar15 * 1e+06 + -100000.0;
    local_218 = deRandom_getFloat(&local_1c8);
    fStack_214 = extraout_XMM0_Db;
    fStack_210 = extraout_XMM0_Dc;
    fStack_20c = extraout_XMM0_Dd;
    fVar15 = deRandom_getFloat(&local_1c8);
    auStack_1b0[0]._0_4_ = local_218 * 1e+06 + -100000.0;
    auStack_1b0[0]._4_4_ = fVar15 * 1e+06 + -100000.0;
    local_1b8._4_4_ = local_208;
    local_1b8._0_4_ = local_1f8;
    std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
    emplace_back<tcu::Vector<float,4>>
              ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)local_248,
               (Vector<float,_4> *)local_1b8);
    iVar7 = iVar7 + -1;
  } while (iVar7 != 0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1e8,
             (long)(local_248._8_8_ - local_248._0_8_) >> 4);
  local_1b8 = (undefined1  [8])
              ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Executing shader for ",0x15)
  ;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," input values",0xd);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_140);
  local_1b8 = (undefined1  [8])local_248._0_8_;
  local_228 = (pointer)local_1e8._0_8_;
  (*((this->super_ShaderPackingFunctionCase).m_executor)->_vptr_ShaderExecutor[5])();
  pSVar3 = (this->super_ShaderPackingFunctionCase).m_executor;
  (*pSVar3->_vptr_ShaderExecutor[6])
            (pSVar3,(ulong)(local_248._8_8_ - local_248._0_8_) >> 4,local_1b8,&local_228);
  local_1d0 = (ulong)(local_248._8_8_ - local_248._0_8_) >> 4;
  if ((int)local_1d0 < 1) {
    iVar7 = 0;
  }
  else {
    poVar1 = (ostringstream *)(local_1b8 + 8);
    lVar10 = 0;
    lVar8 = 0;
    iVar7 = 0;
    local_218 = local_22c;
    fStack_214 = local_22c;
    fStack_210 = local_22c;
    fStack_20c = local_22c;
    lVar5 = local_248._0_8_;
    lVar6 = local_248._8_8_;
    fVar15 = local_22c;
    fVar29 = local_22c;
    fVar30 = local_22c;
    fVar31 = local_22c;
    do {
      auVar17 = *(undefined1 (*) [16])(lVar5 + lVar10);
      auVar22._8_4_ = 0x3f800000;
      auVar22._0_8_ = 0x3f8000003f800000;
      auVar22._12_4_ = 0x3f800000;
      auVar22 = minps(auVar22,auVar17);
      fVar16 = (float)(-(uint)(0.0 <= auVar17._0_4_) & (uint)(auVar22._0_4_ * 255.0));
      fVar18 = (float)(-(uint)(0.0 <= auVar17._4_4_) & (uint)(auVar22._4_4_ * 255.0));
      fVar19 = (float)(-(uint)(0.0 <= auVar17._8_4_) & (uint)(auVar22._8_4_ * 255.0));
      fVar20 = (float)(-(uint)(0.0 <= auVar17._12_4_) & (uint)(auVar22._12_4_ * 255.0));
      uVar11 = -(uint)(fVar16 < 0.0);
      uVar12 = -(uint)(fVar18 < 0.0);
      uVar13 = -(uint)(fVar19 < 0.0);
      uVar14 = -(uint)(fVar20 < 0.0);
      uVar2 = *(uint *)(local_1e8._0_8_ + lVar8 * 4);
      uVar11 = (uint)((float)(uVar11 & 0xbf000000 | ~uVar11 & 0x3f000000) + fVar16);
      uVar12 = (uint)((float)(uVar12 & 0xbf000000 | ~uVar12 & 0x3f000000) + fVar18);
      uVar13 = (uint)((float)(uVar13 & 0xbf000000 | ~uVar13 & 0x3f000000) + fVar19);
      uVar14 = (uint)((float)(uVar14 & 0xbf000000 | ~uVar14 & 0x3f000000) + fVar20);
      uVar21 = -(uint)((int)uVar11 < 0xff);
      uVar25 = -(uint)((int)uVar12 < 0xff);
      uVar26 = -(uint)((int)uVar13 < 0xff);
      uVar27 = -(uint)((int)uVar14 < 0xff);
      uVar11 = ~uVar21 & 0xff | uVar11 & uVar21;
      uStack_1f4 = ~uVar25 & 0xff | uVar12 & uVar25;
      uStack_1f0 = ~uVar26 & 0xff | uVar13 & uVar26;
      uStack_1ec = ~uVar27 & 0xff | uVar14 & uVar27;
      local_1f8 = (float)(-(uint)(0 < (int)uVar11) & uVar11);
      uStack_1f4 = -(uint)(0 < (int)uStack_1f4) & uStack_1f4;
      uStack_1f0 = -(uint)(0 < (int)uStack_1f0) & uStack_1f0;
      uStack_1ec = -(uint)(0 < (int)uStack_1ec) & uStack_1ec;
      uVar21 = (int)local_1f8 - (uVar2 & 0xff);
      uVar25 = uStack_1f4 - (uVar2 >> 8 & 0xff);
      uVar26 = uStack_1f0 - (uVar2 >> 0x10 & 0xff);
      uVar27 = uStack_1ec - (uVar2 >> 0x18);
      uVar11 = (int)uVar21 >> 0x1f;
      uVar12 = (int)uVar25 >> 0x1f;
      uVar13 = (int)uVar26 >> 0x1f;
      uVar14 = (int)uVar27 >> 0x1f;
      local_208 = (float)((uVar21 ^ uVar11) - uVar11);
      iStack_204 = (uVar25 ^ uVar12) - uVar12;
      iStack_200 = (uVar26 ^ uVar13) - uVar13;
      iStack_1fc = (uVar27 ^ uVar14) - uVar14;
      auVar17._0_4_ = -(uint)((int)fVar15 < (int)local_208);
      auVar17._4_4_ = -(uint)((int)fVar29 < iStack_204);
      auVar17._8_4_ = -(uint)((int)fVar30 < iStack_200);
      auVar17._12_4_ = -(uint)((int)fVar31 < iStack_1fc);
      auVar23._4_4_ = auVar17._4_4_;
      auVar23._0_4_ = auVar17._4_4_;
      auVar23._8_4_ = auVar17._4_4_;
      auVar23._12_4_ = auVar17._4_4_;
      auVar28._4_4_ = auVar17._12_4_;
      auVar28._0_4_ = auVar17._8_4_;
      auVar28._8_4_ = auVar17._8_4_;
      auVar28._12_4_ = auVar17._12_4_;
      auVar24._4_4_ = auVar17._12_4_;
      auVar24._0_4_ = auVar17._12_4_;
      auVar24._8_4_ = auVar17._12_4_;
      auVar24._12_4_ = auVar17._12_4_;
      if (((auVar24 | auVar17 | auVar28 | auVar23) & (undefined1  [16])0x1) != (undefined1  [16])0x0
         ) {
        if (iVar7 < 10) {
          local_1b8 = (undefined1  [8])
                      ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                       super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"ERROR: Mismatch in value ",0x19);
          std::ostream::operator<<(poVar1,(int)lVar8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,", expected packUnorm4x8(",0x18);
          tcu::operator<<((ostream *)poVar1,(Vector<float,_4> *)(local_248._0_8_ + lVar10));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,") = ",4);
          local_228 = (pointer)(ulong)((uint)local_1f8 | uStack_1f4 << 8 |
                                      uStack_1f0 << 0x10 | uStack_1ec << 0x18);
          tcu::Format::Hex<8UL>::toStream((Hex<8UL> *)&local_228,(ostream *)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", got ",6);
          local_228 = (pointer)(ulong)uVar2;
          tcu::Format::Hex<8UL>::toStream((Hex<8UL> *)&local_228,(ostream *)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n  diffs = ",0xb);
          local_228 = (pointer)CONCAT44(iStack_204,local_208);
          aiStack_220[1] = iStack_1fc;
          aiStack_220[0] = iStack_200;
          tcu::operator<<((ostream *)poVar1,(Vector<int,_4> *)&local_228);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", max diff = ",0xd);
          std::ostream::operator<<(poVar1,(int)local_22c);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          std::ios_base::~ios_base(local_140);
          fVar15 = local_218;
          fVar29 = fStack_214;
          fVar30 = fStack_210;
          fVar31 = fStack_20c;
        }
        else if (iVar7 == 10) {
          local_1b8 = (undefined1  [8])
                      ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                       super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b8 + 8));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b8 + 8),"...",3);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b8 + 8));
          std::ios_base::~ios_base(local_140);
          fVar15 = local_218;
          fVar29 = fStack_214;
          fVar30 = fStack_210;
          fVar31 = fStack_20c;
        }
        iVar7 = iVar7 + 1;
        lVar5 = local_248._0_8_;
        lVar6 = local_248._8_8_;
      }
      lVar8 = lVar8 + 1;
      lVar10 = lVar10 + 0x10;
    } while (lVar8 < (int)((ulong)(lVar6 - lVar5) >> 4));
  }
  poVar1 = (ostringstream *)(local_1b8 + 8);
  local_1b8 = (undefined1  [8])
              ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  iVar9 = (int)local_1d0;
  std::ostream::operator<<(poVar1,iVar9 - iVar7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," / ",3);
  std::ostream::operator<<(poVar1,iVar9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," values passed",0xe);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_140);
  description = "Pass";
  if (iVar7 != 0) {
    description = "Result comparison failed";
  }
  tcu::TestContext::setTestResult
            ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx,(uint)(iVar7 != 0),description);
  if ((pointer)local_1e8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1e8._0_8_,(long)local_1d8 - local_1e8._0_8_);
  }
  if ((void *)local_248._0_8_ != (void *)0x0) {
    operator_delete((void *)local_248._0_8_,local_238 - local_248._0_8_);
  }
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		de::Random					rnd			(deStringHash(getName()) ^ 0x776002);
		std::vector<tcu::Vec4>		inputs;
		std::vector<deUint32>		outputs;
		const int					maxDiff		= m_precision == glu::PRECISION_HIGHP	? 1	:		// Rounding only.
												  m_precision == glu::PRECISION_MEDIUMP	? 1	:		// (2^-10) * (2^8) + 1
												  m_precision == glu::PRECISION_LOWP	? 2	: 0;	// (2^-8) * (2^8) + 1

		// Special values to check.
		inputs.push_back(tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f));
		inputs.push_back(tcu::Vec4(-1.0f, 1.0f, -1.0f, 1.0f));
		inputs.push_back(tcu::Vec4(0.5f, -0.5f, -0.5f, 0.5f));
		inputs.push_back(tcu::Vec4(-1.5f, 1.5f, -1.5f, 1.5f));
		inputs.push_back(tcu::Vec4(0.25f, -0.75f, -0.25f, 0.75f));

		// Random values, mostly in range.
		for (int ndx = 0; ndx < 15; ndx++)
		{
			const float x = rnd.getFloat()*1.25f - 0.125f;
			const float y = rnd.getFloat()*1.25f - 0.125f;
			const float z = rnd.getFloat()*1.25f - 0.125f;
			const float w = rnd.getFloat()*1.25f - 0.125f;
			inputs.push_back(tcu::Vec4(x, y, z, w));
		}

		// Large random values.
		for (int ndx = 0; ndx < 80; ndx++)
		{
			const float x = rnd.getFloat()*1e6f - 1e5f;
			const float y = rnd.getFloat()*1e6f - 1e5f;
			const float z = rnd.getFloat()*1e6f - 1e5f;
			const float w = rnd.getFloat()*1e6f - 1e5f;
			inputs.push_back(tcu::Vec4(x, y, z, w));
		}

		outputs.resize(inputs.size());

		m_testCtx.getLog() << TestLog::Message << "Executing shader for " << inputs.size() << " input values" << tcu::TestLog::EndMessage;

		{
			const void*	in	= &inputs[0];
			void*		out	= &outputs[0];

			m_executor->useProgram();
			m_executor->execute((int)inputs.size(), &in, &out);
		}

		// Verify
		{
			const int	numValues	= (int)inputs.size();
			const int	maxPrints	= 10;
			int			numFailed	= 0;

			for (int valNdx = 0; valNdx < (int)inputs.size(); valNdx++)
			{
				const deUint16	ref0	= (deUint8)de::clamp(deRoundFloatToInt32(de::clamp(inputs[valNdx].x(), 0.0f, 1.0f) * 255.0f), 0, (1<<8)-1);
				const deUint16	ref1	= (deUint8)de::clamp(deRoundFloatToInt32(de::clamp(inputs[valNdx].y(), 0.0f, 1.0f) * 255.0f), 0, (1<<8)-1);
				const deUint16	ref2	= (deUint8)de::clamp(deRoundFloatToInt32(de::clamp(inputs[valNdx].z(), 0.0f, 1.0f) * 255.0f), 0, (1<<8)-1);
				const deUint16	ref3	= (deUint8)de::clamp(deRoundFloatToInt32(de::clamp(inputs[valNdx].w(), 0.0f, 1.0f) * 255.0f), 0, (1<<8)-1);
				const deUint32	ref		= (deUint32(ref3) << 24) | (deUint32(ref2) << 16) | (deUint32(ref1) << 8) | deUint32(ref0);
				const deUint32	res		= outputs[valNdx];
				const deUint16	res0	= (deUint8)(res & 0xff);
				const deUint16	res1	= (deUint8)((res >> 8) & 0xff);
				const deUint16	res2	= (deUint8)((res >> 16) & 0xff);
				const deUint16	res3	= (deUint8)((res >> 24) & 0xff);
				const int		diff0	= de::abs((int)ref0 - (int)res0);
				const int		diff1	= de::abs((int)ref1 - (int)res1);
				const int		diff2	= de::abs((int)ref2 - (int)res2);
				const int		diff3	= de::abs((int)ref3 - (int)res3);

				if (diff0 > maxDiff || diff1 > maxDiff || diff2 > maxDiff || diff3 > maxDiff)
				{
					if (numFailed < maxPrints)
					{
						m_testCtx.getLog() << TestLog::Message << "ERROR: Mismatch in value " << valNdx
															   << ", expected packUnorm4x8(" << inputs[valNdx] << ") = " << tcu::toHex(ref)
															   << ", got " << tcu::toHex(res)
															   << "\n  diffs = " << tcu::IVec4(diff0, diff1, diff2, diff3) << ", max diff = " << maxDiff
										   << TestLog::EndMessage;
					}
					else if (numFailed == maxPrints)
						m_testCtx.getLog() << TestLog::Message << "..." << TestLog::EndMessage;

					numFailed += 1;
				}
			}

			m_testCtx.getLog() << TestLog::Message << (numValues - numFailed) << " / " << numValues << " values passed" << TestLog::EndMessage;

			m_testCtx.setTestResult(numFailed == 0 ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									numFailed == 0 ? "Pass"					: "Result comparison failed");
		}

		return STOP;
	}